

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_machine.cpp
# Opt level: O0

void __thiscall randomx_vm::initialize(randomx_vm *this)

{
  uint64_t w;
  uint64_t uVar1;
  Program *this_00;
  long in_RDI;
  uint64_t addressRegisters;
  Program *in_stack_ffffffffffffffa0;
  
  w = in_RDI + 0x980;
  uVar1 = randomx::Program::getEntropy(in_stack_ffffffffffffffa0,(int)(w >> 0x20));
  randomx::getSmallPositiveFloatBits(uVar1);
  store64(in_stack_ffffffffffffffa0,w);
  this_00 = (Program *)(in_RDI + 0x988);
  uVar1 = randomx::Program::getEntropy(this_00,(int)(w >> 0x20));
  randomx::getSmallPositiveFloatBits(uVar1);
  store64(this_00,w);
  uVar1 = randomx::Program::getEntropy(this_00,(int)(w >> 0x20));
  randomx::getSmallPositiveFloatBits(uVar1);
  store64(this_00,w);
  uVar1 = randomx::Program::getEntropy(this_00,(int)(w >> 0x20));
  randomx::getSmallPositiveFloatBits(uVar1);
  store64(this_00,w);
  uVar1 = randomx::Program::getEntropy(this_00,(int)(w >> 0x20));
  randomx::getSmallPositiveFloatBits(uVar1);
  store64(this_00,w);
  uVar1 = randomx::Program::getEntropy(this_00,(int)(w >> 0x20));
  randomx::getSmallPositiveFloatBits(uVar1);
  store64(this_00,w);
  uVar1 = randomx::Program::getEntropy(this_00,(int)(w >> 0x20));
  randomx::getSmallPositiveFloatBits(uVar1);
  store64(this_00,w);
  uVar1 = randomx::Program::getEntropy(this_00,(int)(w >> 0x20));
  randomx::getSmallPositiveFloatBits(uVar1);
  store64(this_00,w);
  uVar1 = randomx::Program::getEntropy(this_00,(int)(w >> 0x20));
  *(uint *)(in_RDI + 0x9e4) = (uint)uVar1 & 0x7fffffc0;
  uVar1 = randomx::Program::getEntropy(this_00,(int)(w >> 0x20));
  *(int *)(in_RDI + 0x9e0) = (int)uVar1;
  uVar1 = randomx::Program::getEntropy(this_00,(int)(w >> 0x20));
  *(uint *)(in_RDI + 0x9d0) = (uint)uVar1 & 1;
  *(uint *)(in_RDI + 0x9d4) = ((uint)(uVar1 >> 1) & 1) + 2;
  *(uint *)(in_RDI + 0x9d8) = ((uint)(uVar1 >> 2) & 1) + 4;
  *(uint *)(in_RDI + 0x9dc) = ((uint)(uVar1 >> 3) & 1) + 6;
  uVar1 = randomx::Program::getEntropy(this_00,(int)(w >> 0x20));
  *(uint64_t *)(in_RDI + 0xa00) = (uVar1 & 0x7ffff) << 6;
  randomx::Program::getEntropy(this_00,(int)(w >> 0x20));
  randomx::getFloatMask((uint64_t)this_00);
  store64(this_00,w);
  randomx::Program::getEntropy(this_00,(int)(w >> 0x20));
  randomx::getFloatMask((uint64_t)this_00);
  store64(this_00,w);
  return;
}

Assistant:

void randomx_vm::initialize() {
	store64(&reg.a[0].lo, randomx::getSmallPositiveFloatBits(program.getEntropy(0)));
	store64(&reg.a[0].hi, randomx::getSmallPositiveFloatBits(program.getEntropy(1)));
	store64(&reg.a[1].lo, randomx::getSmallPositiveFloatBits(program.getEntropy(2)));
	store64(&reg.a[1].hi, randomx::getSmallPositiveFloatBits(program.getEntropy(3)));
	store64(&reg.a[2].lo, randomx::getSmallPositiveFloatBits(program.getEntropy(4)));
	store64(&reg.a[2].hi, randomx::getSmallPositiveFloatBits(program.getEntropy(5)));
	store64(&reg.a[3].lo, randomx::getSmallPositiveFloatBits(program.getEntropy(6)));
	store64(&reg.a[3].hi, randomx::getSmallPositiveFloatBits(program.getEntropy(7)));
	mem.ma = program.getEntropy(8) & randomx::CacheLineAlignMask;
	mem.mx = program.getEntropy(10);
	auto addressRegisters = program.getEntropy(12);
	config.readReg0 = 0 + (addressRegisters & 1);
	addressRegisters >>= 1;
	config.readReg1 = 2 + (addressRegisters & 1);
	addressRegisters >>= 1;
	config.readReg2 = 4 + (addressRegisters & 1);
	addressRegisters >>= 1;
	config.readReg3 = 6 + (addressRegisters & 1);
	datasetOffset = (program.getEntropy(13) % (randomx::DatasetExtraItems + 1)) * randomx::CacheLineSize;
	store64(&config.eMask[0], randomx::getFloatMask(program.getEntropy(14)));
	store64(&config.eMask[1], randomx::getFloatMask(program.getEntropy(15)));
}